

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbsdf.c
# Opt level: O0

FT_Error bsdf_raster_new(FT_Memory memory,BSDF_PRaster *araster)

{
  BSDF_PRaster pBVar1;
  BSDF_PRaster raster;
  BSDF_PRaster *ppBStack_18;
  FT_Error error;
  BSDF_PRaster *araster_local;
  FT_Memory memory_local;
  
  ppBStack_18 = araster;
  araster_local = (BSDF_PRaster *)memory;
  pBVar1 = (BSDF_PRaster)ft_mem_alloc(memory,8,(FT_Error *)((long)&raster + 4));
  if (raster._4_4_ == 0) {
    pBVar1->memory = (FT_Memory)araster_local;
  }
  *ppBStack_18 = pBVar1;
  return raster._4_4_;
}

Assistant:

static FT_Error
  bsdf_raster_new( FT_Memory      memory,
                   BSDF_PRaster*  araster )
  {
    FT_Error      error;
    BSDF_PRaster  raster = NULL;


    if ( !FT_NEW( raster ) )
      raster->memory = memory;

    *araster = raster;

    return error;
  }